

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>::
reject(AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>
       *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<unsigned_long> local_1c0;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<unsigned_long>::ExceptionOr(&local_1c0,false,exception_00);
    ExceptionOr<unsigned_long>::operator=(&this->result,&local_1c0);
    ExceptionOr<unsigned_long>::~ExceptionOr(&local_1c0);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }